

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_state_54.cpp
# Opt level: O0

vector<lua_State_*,_std::allocator<lua_State_*>_> *
FindAllCoroutine_lua54
          (vector<lua_State_*,_std::allocator<lua_State_*>_> *__return_storage_ptr__,lua_State *L)

{
  value_type local_30;
  value_type local_28;
  GCObject *head;
  lua_State *local_18;
  lua_State *L_local;
  vector<lua_State_*,_std::allocator<lua_State_*>_> *result;
  
  head._7_1_ = 0;
  local_18 = L;
  L_local = (lua_State *)__return_storage_ptr__;
  std::vector<lua_State_*,_std::allocator<lua_State_*>_>::vector(__return_storage_ptr__);
  for (local_28 = (value_type)local_18->l_G->allgc; local_28 != (value_type)0x0;
      local_28 = (value_type)local_28->next) {
    if (local_28->tt == '\b') {
      local_30 = local_28;
      std::vector<lua_State_*,_std::allocator<lua_State_*>_>::push_back
                (__return_storage_ptr__,&local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<lua_State*> FindAllCoroutine_lua54(lua_State* L)
{
	std::vector<lua_State*> result;
	auto head = G(L)->allgc;

	while (head)
	{
		if (head->tt == LUA_TTHREAD)
		{
			result.push_back(reinterpret_cast<lua_State*>(head));
		}
		head = head->next;
	}

	return result;
}